

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DFAContentModel::validateContent
          (DFAContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          XMLSize_t *indexFailingChild,MemoryManager *param_5)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  XMLCh *pXVar4;
  XMLCh *str2;
  Occurence *o;
  uint local_78;
  uint nextLoop;
  uint uriId;
  NodeTypes type;
  QName *inElem;
  XMLCh *pXStack_60;
  uint elemIndex;
  XMLCh *curElemRawName;
  QName *curElem;
  uint childIndex;
  uint loopCount;
  uint nextState;
  uint curState;
  MemoryManager *param_5_local;
  XMLSize_t *indexFailingChild_local;
  ulong uStack_28;
  uint param_3_local;
  XMLSize_t childCount_local;
  QName **children_local;
  DFAContentModel *this_local;
  
  if (childCount == 0) {
    if ((this->fEmptyOk & 1U) == 0) {
      *indexFailingChild = 0;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    loopCount = 0;
    childIndex = 0;
    curElem._4_4_ = 0;
    _nextState = param_5;
    param_5_local = (MemoryManager *)indexFailingChild;
    indexFailingChild_local._4_4_ = param_3;
    uStack_28 = childCount;
    childCount_local = (XMLSize_t)children;
    children_local = (QName **)this;
    for (curElem._0_4_ = 0; (uint)curElem < uStack_28; curElem._0_4_ = (uint)curElem + 1) {
      curElemRawName = *(XMLCh **)(childCount_local + (ulong)(uint)curElem * 8);
      pXStack_60 = (XMLCh *)0x0;
      if ((this->fDTD & 1U) != 0) {
        pXStack_60 = QName::getRawName((QName *)curElemRawName);
      }
      if (((this->fIsMixed & 1U) == 0) ||
         (uVar2 = QName::getURI((QName *)curElemRawName), uVar2 != 0xffffffff)) {
        for (inElem._4_4_ = 0; inElem._4_4_ < this->fElemMapSize; inElem._4_4_ = inElem._4_4_ + 1) {
          _uriId = this->fElemMap[inElem._4_4_];
          if ((this->fDTD & 1U) == 0) {
            nextLoop = this->fElemMapType[inElem._4_4_];
            if (nextLoop == Leaf) {
              uVar2 = QName::getURI(_uriId);
              uVar3 = QName::getURI((QName *)curElemRawName);
              if (uVar2 == uVar3) {
                pXVar4 = QName::getLocalPart(_uriId);
                str2 = QName::getLocalPart((QName *)curElemRawName);
                bVar1 = XMLString::equals(pXVar4,str2);
                if (bVar1) {
                  childIndex = this->fTransTable[loopCount][inElem._4_4_];
                  goto joined_r0x003ca1ba;
                }
              }
            }
            else if ((nextLoop & (Any_NS|Any_Other)) == Any) {
              childIndex = this->fTransTable[loopCount][inElem._4_4_];
joined_r0x003ca1ba:
              if (childIndex != 0xffffffff) break;
            }
            else if ((nextLoop & (Any_NS|Any_Other)) == Any_NS) {
              uVar2 = QName::getURI(_uriId);
              uVar3 = QName::getURI((QName *)curElemRawName);
              if (uVar2 == uVar3) {
                childIndex = this->fTransTable[loopCount][inElem._4_4_];
                goto joined_r0x003ca1ba;
              }
            }
            else if ((((nextLoop & (Any_NS|Any_Other)) == Any_Other) &&
                     (uVar2 = QName::getURI((QName *)curElemRawName), local_78 = uVar2, uVar2 != 1))
                    && (uVar3 = QName::getURI(_uriId), uVar2 != uVar3)) {
              childIndex = this->fTransTable[loopCount][inElem._4_4_];
              goto joined_r0x003ca1ba;
            }
          }
          else {
            pXVar4 = QName::getRawName(_uriId);
            bVar1 = XMLString::equals(pXVar4,pXStack_60);
            if (bVar1) {
              childIndex = this->fTransTable[loopCount][inElem._4_4_];
              goto joined_r0x003ca1ba;
            }
          }
        }
        if (childIndex == 0xffffffff) {
          param_5_local->_vptr_MemoryManager = (_func_int **)(ulong)(uint)curElem;
          return false;
        }
        if (inElem._4_4_ == this->fElemMapSize) {
          param_5_local->_vptr_MemoryManager = (_func_int **)(ulong)(uint)curElem;
          return false;
        }
        o._4_4_ = 0;
        uVar2 = (*(this->super_XMLContentModel)._vptr_XMLContentModel[7])
                          (this,curElemRawName,(ulong)loopCount,(ulong)curElem._4_4_,&childIndex,
                           (long)&o + 4,(ulong)inElem._4_4_,0);
        if ((uVar2 & 1) == 0) {
          param_5_local->_vptr_MemoryManager = (_func_int **)(ulong)(uint)curElem;
          return false;
        }
        loopCount = childIndex;
        curElem._4_4_ = o._4_4_;
        childIndex = 0;
      }
    }
    if ((this->fFinalStateFlags[loopCount] & 1U) == 0) {
      param_5_local->_vptr_MemoryManager = (_func_int **)(ulong)(uint)curElem;
      this_local._7_1_ = false;
    }
    else if (((this->fCountingStates == (Occurence **)0x0) ||
             (this->fCountingStates[loopCount] == (Occurence *)0x0)) ||
            ((uint)this->fCountingStates[loopCount]->minOccurs <= curElem._4_4_)) {
      this_local._7_1_ = true;
    }
    else {
      param_5_local->_vptr_MemoryManager = (_func_int **)(ulong)(uint)curElem;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
DFAContentModel::validateContent( QName** const        children
                                , XMLSize_t            childCount
                                , unsigned int
                                , XMLSize_t*           indexFailingChild
                                , MemoryManager*    const) const
{
    //
    //  If there are no children, then either we fail on the 0th element
    //  or we return success. It depends upon whether this content model
    //  accepts empty content, which we determined earlier.
    //
    if (!childCount)
    {
        // success
        if(fEmptyOk)
            return true;
        *indexFailingChild=0;
        return false;
    }

    //
    //  Lets loop through the children in the array and move our way
    //  through the states. Note that we use the fElemMap array to map
    //  an element index to a state index.
    //
    unsigned int curState = 0;
    unsigned int nextState = 0;
    unsigned int loopCount = 0;
    unsigned int childIndex = 0;
    for (; childIndex < childCount; childIndex++)
    {
        // Get the current element index out
        const QName* curElem = children[childIndex];
        const XMLCh* curElemRawName = 0;
        if (fDTD)
            curElemRawName = curElem->getRawName();

        // If this is text in a Schema mixed content model, skip it.
        if ( fIsMixed &&
            ( curElem->getURI() == XMLElementDecl::fgPCDataElemId))
            continue;

        // Look up this child in our element map
        unsigned int elemIndex = 0;
        for (; elemIndex < fElemMapSize; elemIndex++)
        {
            const QName* inElem  = fElemMap[elemIndex];
            if (fDTD) {
                if (XMLString::equals(inElem->getRawName(), curElemRawName)) {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else {
                ContentSpecNode::NodeTypes type = fElemMapType[elemIndex];
                if (type == ContentSpecNode::Leaf)
                {
                    if ((inElem->getURI() == curElem->getURI()) &&
                    (XMLString::equals(inElem->getLocalPart(), curElem->getLocalPart()))) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f)== ContentSpecNode::Any)
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_NS)
                {
                    if (inElem->getURI() == curElem->getURI())
                    {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_Other)
                {
                    // Here we assume that empty string has id 1.
                    //
                    unsigned int uriId = curElem->getURI();
                    if (uriId != 1 && uriId != inElem->getURI()) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
            }
        }//for elemIndex

        // If "nextState" is -1, we found a match, but the transition is invalid
        if (nextState == XMLContentModel::gInvalidTrans)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        // If we didn't find it, then obviously not valid
        if (elemIndex == fElemMapSize)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        unsigned int nextLoop = 0;
        if(!handleRepetitions(curElem, curState, loopCount, nextState, nextLoop, elemIndex, 0))
        {
            *indexFailingChild=childIndex;
            return false;
        }

        curState = nextState;
        loopCount = nextLoop;
        nextState = 0;

    }//for childIndex

    //
    //  We transitioned all the way through the input list. However, that
    //  does not mean that we ended in a final state. So check whether
    //  our ending state is a final state.
    //
    if (!fFinalStateFlags[curState])
    {
        *indexFailingChild=childIndex;
        return false;
    }

    // verify if we exited before the minOccurs was satisfied
    if (fCountingStates != 0) {
        Occurence* o = fCountingStates[curState];
        if (o != 0 && loopCount < (unsigned int)o->minOccurs) {
            // not enough loops on the current state to be considered final.
            *indexFailingChild=childIndex;
            return false;
        }
    }

    //success
    return true;
}